

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O0

void jas_matrix_divpow2(jas_matrix_t *matrix,int n)

{
  jas_matind_t jVar1;
  size_t sVar2;
  long local_48;
  long *local_40;
  jas_seqent_t *data;
  jas_matind_t rowstep;
  jas_seqent_t *rowstart;
  jas_matind_t j;
  jas_matind_t i;
  int n_local;
  jas_matrix_t *matrix_local;
  
  jVar1 = jas_matrix_numrows(matrix);
  if ((0 < jVar1) && (jVar1 = jas_matrix_numcols(matrix), 0 < jVar1)) {
    if (matrix->rows_ == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x11b,"void jas_matrix_divpow2(jas_matrix_t *, int)");
    }
    sVar2 = jas_matrix_rowstep(matrix);
    rowstep = (jas_matind_t)*matrix->rows_;
    for (j = matrix->numrows_; 0 < j; j = j + -1) {
      rowstart = (jas_seqent_t *)matrix->numcols_;
      local_40 = (long *)rowstep;
      for (; 0 < (long)rowstart; rowstart = (jas_seqent_t *)((long)rowstart + -1)) {
        if (*local_40 < 0) {
          local_48 = -(-*local_40 >> ((byte)n & 0x3f));
        }
        else {
          local_48 = *local_40 >> ((byte)n & 0x3f);
        }
        *local_40 = local_48;
        local_40 = local_40 + 1;
      }
      rowstep = sVar2 * 8 + rowstep;
    }
  }
  return;
}

Assistant:

void jas_matrix_divpow2(jas_matrix_t *matrix, int n)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t *rowstart;
	jas_matind_t rowstep;
	jas_seqent_t *data;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				*data = (*data >= 0) ? ((*data) >> n) :
				  (-((-(*data)) >> n));
			}
		}
	}
}